

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::WebSocket,_std::nullptr_t> __thiscall
kj::anon_unknown_36::HttpClientAdapter::WebSocketResponseImpl::acceptWebSocket
          (WebSocketResponseImpl *this,HttpHeaders *headers)

{
  Own<kj::WebSocket,_std::nullptr_t> *pOVar1;
  PromiseFulfiller<kj::HttpClient::WebSocketResponse> *pPVar2;
  int in_ECX;
  __fn *in_RDX;
  WebSocket *extraout_RDX;
  void *in_R8;
  Own<kj::WebSocket,_std::nullptr_t> OVar3;
  Own<kj::WebSocket,_std::nullptr_t> local_140;
  undefined1 local_130 [56];
  undefined1 local_f8 [40];
  undefined1 local_d0 [8];
  Own<kj::WebSocket,_std::nullptr_t> wrapper;
  WebSocketPipe pipe;
  HttpHeaders local_90;
  undefined1 local_30 [8];
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  HttpHeaders *headers_local;
  WebSocketResponseImpl *this_local;
  
  HttpHeaders::clone(&local_90,in_RDX,in_RDX,in_ECX,in_R8);
  heap<kj::HttpHeaders>((kj *)local_30,&local_90);
  HttpHeaders::~HttpHeaders(&local_90);
  newWebSocketPipe();
  pOVar1 = mv<kj::Own<kj::WebSocket,decltype(nullptr)>>
                     ((Own<kj::WebSocket,_std::nullptr_t> *)&wrapper.ptr);
  addRef<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>
            ((kj *)local_f8,(WebSocketResponseImpl *)headers);
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
            ((Promise<void> *)(local_f8 + 0x10),
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&(headers->unindexedHeaders).builder.pos);
  heap<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket,kj::Own<kj::WebSocket,decltype(nullptr)>,kj::Promise<void>>
            ((kj *)(local_f8 + 0x18),pOVar1,(Promise<void> *)(local_f8 + 0x10));
  Own<kj::WebSocket,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket,void>
            ((Own<kj::WebSocket,decltype(nullptr)> *)local_d0,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket,_std::nullptr_t>
              *)(local_f8 + 0x18));
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket,_std::nullptr_t>
              *)(local_f8 + 0x18));
  Promise<void>::~Promise((Promise<void> *)(local_f8 + 0x10));
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)local_f8);
  pPVar2 = Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,_std::nullptr_t>
                       *)&(headers->indexedHeaders).disposer);
  local_130._0_4_ = 0x65;
  StringPtr::StringPtr((StringPtr *)(local_130 + 8),"Switching Protocols");
  local_130._24_8_ =
       Own<kj::HttpHeaders,_std::nullptr_t>::get((Own<kj::HttpHeaders,_std::nullptr_t> *)local_30);
  mv<kj::Own<kj::HttpHeaders,decltype(nullptr)>>((Own<kj::HttpHeaders,_std::nullptr_t> *)local_30);
  Own<kj::WebSocket,decltype(nullptr)>::attach<kj::Own<kj::HttpHeaders,decltype(nullptr)>>
            ((Own<kj::WebSocket,decltype(nullptr)> *)&local_140,
             (Own<kj::HttpHeaders,_std::nullptr_t> *)local_d0);
  OneOf<kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::Own<kj::WebSocket,decltype(nullptr)>>::
  OneOf<kj::Own<kj::WebSocket,decltype(nullptr)>,int>
            ((OneOf<kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::Own<kj::WebSocket,decltype(nullptr)>>
              *)(local_130 + 0x20),&local_140);
  (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar2,local_130);
  HttpClient::WebSocketResponse::~WebSocketResponse((WebSocketResponse *)local_130);
  Own<kj::WebSocket,_std::nullptr_t>::~Own(&local_140);
  pOVar1 = mv<kj::Own<kj::WebSocket,decltype(nullptr)>>
                     ((Own<kj::WebSocket,_std::nullptr_t> *)&pipe.ends[0].ptr);
  Own<kj::WebSocket,_std::nullptr_t>::Own((Own<kj::WebSocket,_std::nullptr_t> *)this,pOVar1);
  Own<kj::WebSocket,_std::nullptr_t>::~Own((Own<kj::WebSocket,_std::nullptr_t> *)local_d0);
  WebSocketPipe::~WebSocketPipe((WebSocketPipe *)&wrapper.ptr);
  Own<kj::HttpHeaders,_std::nullptr_t>::~Own((Own<kj::HttpHeaders,_std::nullptr_t> *)local_30);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<WebSocket> acceptWebSocket(const HttpHeaders& headers) override {
      // The caller of HttpClient is allowed to assume that the headers remain valid until the body
      // stream is dropped, but the HttpService implementation is allowed to send headers that are
      // only valid until acceptWebSocket() returns, so we have to copy.
      auto headersCopy = kj::heap(headers.clone());

      auto pipe = newWebSocketPipe();

      // Wrap the client-side WebSocket in a wrapper that delays clean close of the WebSocket until
      // the service's request promise has finished.
      kj::Own<WebSocket> wrapper =
          kj::heap<DelayedCloseWebSocket>(kj::mv(pipe.ends[0]), task.attach(kj::addRef(*this)));
      fulfiller->fulfill({
        101, "Switching Protocols", headersCopy.get(),
        wrapper.attach(kj::mv(headersCopy))
      });
      return kj::mv(pipe.ends[1]);
    }